

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O3

int phyr::SampledSpectrum::init(EVP_PKEY_CTX *ctx)

{
  long lVar1;
  int extraout_EAX;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  lVar2 = 0;
  do {
    dVar3 = (double)(int)lVar2 / 60.0;
    dVar5 = (1.0 - dVar3) * 400.0 + dVar3 * 700.0;
    lVar1 = lVar2 + 1;
    dVar3 = (double)(int)lVar1 / 60.0;
    dVar4 = (1.0 - dVar3) * 400.0 + dVar3 * 700.0;
    dVar3 = averageSampleRange((double *)CIE_LAMBDA,(double *)CIE_X,0x1d7,dVar5,dVar4);
    (&X)[lVar2] = dVar3;
    dVar3 = averageSampleRange((double *)CIE_LAMBDA,(double *)CIE_Y,0x1d7,dVar5,dVar4);
    (&Y)[lVar2] = dVar3;
    dVar3 = averageSampleRange((double *)CIE_LAMBDA,(double *)CIE_Z,0x1d7,dVar5,dVar4);
    (&Z)[lVar2] = dVar3;
    lVar2 = lVar1;
  } while (lVar1 != 0x3c);
  lVar2 = 0;
  do {
    dVar3 = (double)(int)lVar2 / 60.0;
    dVar5 = (1.0 - dVar3) * 400.0 + dVar3 * 700.0;
    lVar1 = lVar2 + 1;
    dVar3 = (double)(int)lVar1 / 60.0;
    dVar4 = (1.0 - dVar3) * 400.0 + dVar3 * 700.0;
    dVar3 = averageSampleRange((double *)RGB2SpectLambda,(double *)RGBRefl2SpectWhite,0x20,dVar5,
                               dVar4);
    (&rgbRefl2SpectWhite)[lVar2] = dVar3;
    dVar3 = averageSampleRange((double *)RGB2SpectLambda,(double *)RGBRefl2SpectCyan,0x20,dVar5,
                               dVar4);
    (&rgbRefl2SpectCyan)[lVar2] = dVar3;
    dVar3 = averageSampleRange((double *)RGB2SpectLambda,(double *)RGBRefl2SpectMagenta,0x20,dVar5,
                               dVar4);
    (&rgbRefl2SpectMagenta)[lVar2] = dVar3;
    dVar3 = averageSampleRange((double *)RGB2SpectLambda,(double *)RGBRefl2SpectYellow,0x20,dVar5,
                               dVar4);
    (&rgbRefl2SpectYellow)[lVar2] = dVar3;
    dVar3 = averageSampleRange((double *)RGB2SpectLambda,(double *)RGBRefl2SpectRed,0x20,dVar5,dVar4
                              );
    (&rgbRefl2SpectRed)[lVar2] = dVar3;
    dVar3 = averageSampleRange((double *)RGB2SpectLambda,(double *)RGBRefl2SpectGreen,0x20,dVar5,
                               dVar4);
    (&rgbRefl2SpectGreen)[lVar2] = dVar3;
    dVar3 = averageSampleRange((double *)RGB2SpectLambda,(double *)RGBRefl2SpectBlue,0x20,dVar5,
                               dVar4);
    (&rgbRefl2SpectBlue)[lVar2] = dVar3;
    dVar3 = averageSampleRange((double *)RGB2SpectLambda,(double *)RGBIllum2SpectWhite,0x20,dVar5,
                               dVar4);
    (&rgbIllum2SpectWhite)[lVar2] = dVar3;
    dVar3 = averageSampleRange((double *)RGB2SpectLambda,(double *)RGBIllum2SpectCyan,0x20,dVar5,
                               dVar4);
    (&rgbIllum2SpectCyan)[lVar2] = dVar3;
    dVar3 = averageSampleRange((double *)RGB2SpectLambda,(double *)RGBIllum2SpectMagenta,0x20,dVar5,
                               dVar4);
    (&rgbIllum2SpectMagenta)[lVar2] = dVar3;
    dVar3 = averageSampleRange((double *)RGB2SpectLambda,(double *)RGBIllum2SpectYellow,0x20,dVar5,
                               dVar4);
    (&rgbIllum2SpectYellow)[lVar2] = dVar3;
    dVar3 = averageSampleRange((double *)RGB2SpectLambda,(double *)RGBIllum2SpectRed,0x20,dVar5,
                               dVar4);
    (&rgbIllum2SpectRed)[lVar2] = dVar3;
    dVar3 = averageSampleRange((double *)RGB2SpectLambda,(double *)RGBIllum2SpectGreen,0x20,dVar5,
                               dVar4);
    (&rgbIllum2SpectGreen)[lVar2] = dVar3;
    dVar3 = averageSampleRange((double *)RGB2SpectLambda,(double *)RGBIllum2SpectBlue,0x20,dVar5,
                               dVar4);
    (&rgbIllum2SpectBlue)[lVar2] = dVar3;
    lVar2 = lVar1;
  } while (lVar1 != 0x3c);
  return extraout_EAX;
}

Assistant:

static void init() {
        // Initiate X, Y, and Z spectrums
        for (int i = 0; i < nSampleSize; i++) {
            Real l0 = lerp(Real(i) / nSampleSize,
                           spectrumWavelengthStart, spectrumWavelengthEnd);
            Real l1 = lerp(Real(i + 1) / nSampleSize,
                           spectrumWavelengthStart, spectrumWavelengthEnd);
            X.samples[i] = averageSampleRange(CIE_LAMBDA, CIE_X, nCIESamples, l0, l1);
            Y.samples[i] = averageSampleRange(CIE_LAMBDA, CIE_Y, nCIESamples, l0, l1);
            Z.samples[i] = averageSampleRange(CIE_LAMBDA, CIE_Z, nCIESamples, l0, l1);
        }

        // Initiate spectrums for RGB to XYZ conversion
        for (int i = 0; i < nSampleSize; ++i) {
            Real l0 = lerp(Real(i) / nSampleSize,
                           spectrumWavelengthStart, spectrumWavelengthEnd);
            Real l1 = lerp(Real(i + 1) / nSampleSize,
                           spectrumWavelengthStart, spectrumWavelengthEnd);
            rgbRefl2SpectWhite.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBRefl2SpectWhite,
                                       nRGB2SpectSamples, l0, l1);
            rgbRefl2SpectCyan.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBRefl2SpectCyan,
                                       nRGB2SpectSamples, l0, l1);
            rgbRefl2SpectMagenta.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBRefl2SpectMagenta,
                                       nRGB2SpectSamples, l0, l1);
            rgbRefl2SpectYellow.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBRefl2SpectYellow,
                                       nRGB2SpectSamples, l0, l1);
            rgbRefl2SpectRed.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBRefl2SpectRed,
                                       nRGB2SpectSamples, l0, l1);
            rgbRefl2SpectGreen.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBRefl2SpectGreen,
                                       nRGB2SpectSamples, l0, l1);
            rgbRefl2SpectBlue.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBRefl2SpectBlue,
                                       nRGB2SpectSamples, l0, l1);
            rgbIllum2SpectWhite.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBIllum2SpectWhite,
                                       nRGB2SpectSamples, l0, l1);
            rgbIllum2SpectCyan.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBIllum2SpectCyan,
                                       nRGB2SpectSamples, l0, l1);
            rgbIllum2SpectMagenta.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBIllum2SpectMagenta,
                                       nRGB2SpectSamples, l0, l1);
            rgbIllum2SpectYellow.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBIllum2SpectYellow,
                                       nRGB2SpectSamples, l0, l1);
            rgbIllum2SpectRed.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBIllum2SpectRed,
                                       nRGB2SpectSamples, l0, l1);
            rgbIllum2SpectGreen.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBIllum2SpectGreen,
                                       nRGB2SpectSamples, l0, l1);
            rgbIllum2SpectBlue.samples[i] =
                    averageSampleRange(RGB2SpectLambda, RGBIllum2SpectBlue,
                                       nRGB2SpectSamples, l0, l1);
        }
    }